

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

void __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::ShrinkToFit
          (Stack<rapidjson::CrtAllocator> *this)

{
  bool bVar1;
  Stack<rapidjson::CrtAllocator> *in_RDI;
  size_t in_stack_00000008;
  
  bVar1 = Empty(in_RDI);
  if (bVar1) {
    CrtAllocator::Free((void *)0x4b41ec);
    in_RDI->stack_ = (char *)0x0;
    in_RDI->stackTop_ = (char *)0x0;
    in_RDI->stackEnd_ = (char *)0x0;
  }
  else {
    GetSize(in_RDI);
    Resize(this,in_stack_00000008);
  }
  return;
}

Assistant:

void ShrinkToFit() { 
        if (Empty()) {
            // If the stack is empty, completely deallocate the memory.
            Allocator::Free(stack_); // NOLINT (+clang-analyzer-unix.Malloc)
            stack_ = 0;
            stackTop_ = 0;
            stackEnd_ = 0;
        }
        else
            Resize(GetSize());
    }